

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::C_VerifyFinal
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pSignature,CK_ULONG ulSignatureLen)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  Session *this_00;
  MacAlgorithm *pMVar4;
  undefined4 extraout_var;
  AsymmetricAlgorithm *pAVar5;
  PublicKey *pPVar6;
  CK_ULONG CVar7;
  char *functionName;
  CK_RV CVar8;
  ByteString BStack_58;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (pSignature == (CK_BYTE_PTR)0x0) {
    return 7;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  iVar3 = Session::getOpType(this_00);
  if (iVar3 != 6) {
    return 0x91;
  }
  bVar1 = Session::getAllowMultiPartOp(this_00);
  if (!bVar1) {
    return 0x91;
  }
  pMVar4 = Session::getMacOp(this_00);
  if (pMVar4 == (MacAlgorithm *)0x0) {
    pAVar5 = Session::getAsymmetricCryptoOp(this_00);
    pPVar6 = Session::getPublicKey(this_00);
    if (pAVar5 == (AsymmetricAlgorithm *)0x0 || pPVar6 == (PublicKey *)0x0) goto LAB_0013811b;
    CVar7 = (**(code **)(*(long *)pPVar6 + 0x28))(pPVar6);
    if (CVar7 != ulSignatureLen) {
      functionName = "AsymVerifyFinal";
      iVar3 = 0x166f;
      goto LAB_001381b3;
    }
    ByteString::ByteString(&BStack_58,pSignature,ulSignatureLen);
    iVar3 = (*pAVar5->_vptr_AsymmetricAlgorithm[9])(pAVar5,&BStack_58);
    cVar2 = (char)iVar3;
    Session::resetOp(this_00);
  }
  else {
    pMVar4 = Session::getMacOp(this_00);
    if (pMVar4 == (MacAlgorithm *)0x0) {
LAB_0013811b:
      Session::resetOp(this_00);
      return 0x91;
    }
    iVar3 = (*pMVar4->_vptr_MacAlgorithm[0xb])(pMVar4);
    if (CONCAT44(extraout_var,iVar3) != ulSignatureLen) {
      functionName = "MacVerifyFinal";
      iVar3 = 0x164b;
LAB_001381b3:
      softHSMLog(3,functionName,
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,iVar3,"The size of the signature differs from the size of the mechanism");
      Session::resetOp(this_00);
      return 0xc1;
    }
    ByteString::ByteString(&BStack_58,pSignature,ulSignatureLen);
    iVar3 = (*pMVar4->_vptr_MacAlgorithm[7])(pMVar4,&BStack_58);
    cVar2 = (char)iVar3;
    Session::resetOp(this_00);
  }
  CVar8 = 0xc0;
  if (cVar2 != '\0') {
    CVar8 = 0;
  }
  ByteString::~ByteString(&BStack_58);
  return CVar8;
}

Assistant:

CK_RV SoftHSM::C_VerifyFinal(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pSignature, CK_ULONG ulSignatureLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pSignature == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_VERIFY || !session->getAllowMultiPartOp())
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getMacOp() != NULL)
		return MacVerifyFinal(session, pSignature, ulSignatureLen);
	else
		return AsymVerifyFinal(session, pSignature, ulSignatureLen);
}